

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O3

Vec_Int_t * Sbc_ManDetectMult(Gia_Man_t *p,Vec_Int_t *vIns)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  ulong uVar6;
  word **__ptr;
  int iVar7;
  uint uVar8;
  Vec_Int_t *pVVar9;
  Vec_Mem_t *p_00;
  Vec_Wrd_t *pVVar10;
  word *pwVar11;
  int *piVar12;
  word *pwVar13;
  word *pwVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  word B [64];
  word A [64];
  word R [128];
  int *local_860;
  word local_838 [64];
  word local_638 [64];
  word local_438 [129];
  
  iVar16 = p->nObjs;
  lVar20 = (long)iVar16;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  iVar21 = 0x10;
  if (0xe < iVar16 - 1U) {
    iVar21 = iVar16;
  }
  pVVar9->nCap = iVar21;
  if (iVar21 == 0) {
    pVVar9->pArray = (int *)0x0;
    pVVar9->nSize = iVar16;
LAB_0035cb57:
    local_860 = (int *)0x0;
  }
  else {
    local_860 = (int *)malloc((long)iVar21 << 2);
    pVVar9->pArray = local_860;
    pVVar9->nSize = iVar16;
    if (local_860 == (int *)0x0) goto LAB_0035cb57;
    memset(local_860,0xff,lVar20 * 4);
  }
  iVar16 = vIns->nSize;
  iVar21 = iVar16 / 2;
  p_00 = (Vec_Mem_t *)calloc(1,0x30);
  p_00->nEntrySize = 1;
  p_00->LogPageSze = 10;
  p_00->PageMask = 0x3ff;
  p_00->iPage = -1;
  Vec_MemHashAlloc(p_00,1000);
  pwVar14 = local_638;
  pwVar11 = local_438;
  Sbc_SimMult(pwVar14,local_838,pwVar11,iVar21);
  uVar19 = iVar16 - (iVar16 >> 0x1f) & 0xfffffffe;
  if (1 < iVar16) {
    uVar22 = 1;
    if (1 < (int)uVar19) {
      uVar22 = (ulong)uVar19;
    }
    do {
      Vec_MemHashInsert(p_00,pwVar11);
      pwVar11 = pwVar11 + 1;
      uVar22 = uVar22 - 1;
    } while (uVar22 != 0);
  }
  if (p_00->nEntries != uVar19) {
    __assert_fail("Vec_MemEntryNum(vTtMem) == 2*nIns",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                  ,0x16e,"Vec_Int_t *Sbc_ManDetectMult(Gia_Man_t *, Vec_Int_t *)");
  }
  pVVar10 = p->vSims;
  if (pVVar10 != (Vec_Wrd_t *)0x0) {
    if (pVVar10->pArray != (word *)0x0) {
      free(pVVar10->pArray);
      p->vSims->pArray = (word *)0x0;
      pVVar10 = p->vSims;
      if (pVVar10 == (Vec_Wrd_t *)0x0) goto LAB_0035cc59;
    }
    free(pVVar10);
  }
LAB_0035cc59:
  iVar16 = p->nObjs;
  pVVar10 = (Vec_Wrd_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar16 - 1U) {
    iVar7 = iVar16;
  }
  pVVar10->nCap = iVar7;
  if (iVar7 == 0) {
    pwVar11 = (word *)0x0;
  }
  else {
    pwVar11 = (word *)malloc((long)iVar7 << 3);
  }
  pVVar10->pArray = pwVar11;
  pVVar10->nSize = iVar16;
  memset(pwVar11,0,(long)iVar16 << 3);
  p->vSims = pVVar10;
  p->nSimWords = 1;
  Gia_ManIncrementTravId(p);
  if (p->nTravIdsAlloc < 1) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
  }
  iVar16 = p->nTravIds;
  piVar12 = p->pTravIds;
  *piVar12 = iVar16;
  pVVar4 = p->vCis;
  if (0 < pVVar4->nSize) {
    piVar5 = pVVar4->pArray;
    lVar17 = 0;
    do {
      iVar7 = piVar5[lVar17];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_0035d0ff;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p->nTravIdsAlloc <= iVar7) goto LAB_0035d11e;
      piVar12[iVar7] = iVar16;
      lVar17 = lVar17 + 1;
    } while (lVar17 < pVVar4->nSize);
  }
  if ((vIns->nSize & 1U) != 0) {
    __assert_fail("Vec_IntSize(vIns) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                  ,0x17f,"Vec_Int_t *Sbc_ManDetectMult(Gia_Man_t *, Vec_Int_t *)");
  }
  if (vIns->nSize < 1) {
    iVar7 = p->nObjs;
  }
  else {
    piVar5 = vIns->pArray;
    pwVar11 = local_838 + -(long)iVar21;
    lVar17 = 0;
    do {
      iVar1 = piVar5[lVar17];
      if (((long)iVar1 < 0) || (iVar7 = p->nObjs, iVar7 <= iVar1)) goto LAB_0035d0ff;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p->nTravIdsAlloc <= iVar1) {
LAB_0035d11e:
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x262,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      piVar12[iVar1] = iVar16;
      iVar7 = p->nObjs;
      if (iVar7 <= iVar1) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar19 = iVar1 * p->nSimWords;
      if (((int)uVar19 < 0) || (p->vSims->nSize <= (int)uVar19)) goto LAB_0035d0e0;
      pwVar13 = pwVar11;
      if (lVar17 < iVar21) {
        pwVar13 = pwVar14;
      }
      p->vSims->pArray[uVar19] = *pwVar13;
      lVar17 = lVar17 + 1;
      pwVar11 = pwVar11 + 1;
      pwVar14 = pwVar14 + 1;
    } while (lVar17 < vIns->nSize);
  }
  if (1 < iVar7) {
    lVar17 = 1;
    do {
      if (p->nTravIdsAlloc <= lVar17) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x264,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      if (p->pTravIds[lVar17] != p->nTravIds) {
        uVar19 = (uint)*(ulong *)(p->pObjs + lVar17);
        uVar22 = *(ulong *)(p->pObjs + lVar17) & 0x1fffffff;
        iVar16 = (int)lVar17;
        if (uVar22 == 0x1fffffff || (int)uVar19 < 0) {
          if ((-1 < (int)uVar19) || ((int)uVar22 == 0x1fffffff)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                          ,0x191,"Vec_Int_t *Sbc_ManDetectMult(Gia_Man_t *, Vec_Int_t *)");
          }
          uVar2 = p->nSimWords;
          uVar8 = uVar2 * iVar16;
          if ((int)uVar8 < 0) goto LAB_0035d0e0;
          uVar3 = p->vSims->nSize;
          if ((int)uVar3 <= (int)uVar8) goto LAB_0035d0e0;
          uVar15 = uVar19 & 0x1fffffff;
          uVar18 = (iVar16 - uVar15) * uVar2;
          if (((int)uVar18 < 0) || (uVar3 <= uVar18)) goto LAB_0035d0e0;
          pwVar14 = p->vSims->pArray;
          if ((uVar19 >> 0x1d & 1) == 0) {
            if (0 < (int)uVar2) {
              uVar22 = 0;
              do {
                pwVar14[uVar2 * iVar16 + uVar22] = pwVar14[(iVar16 - uVar15) * uVar2 + uVar22];
                uVar22 = uVar22 + 1;
              } while (uVar2 != uVar22);
              goto LAB_0035cf50;
            }
          }
          else if (0 < (int)uVar2) {
            uVar22 = 0;
            do {
              pwVar14[uVar2 * iVar16 + uVar22] = ~pwVar14[(iVar16 - uVar15) * uVar2 + uVar22];
              uVar22 = uVar22 + 1;
            } while (uVar2 != uVar22);
            goto LAB_0035cf50;
          }
        }
        else {
          Wlc_ObjSimAnd(p,iVar16);
          uVar8 = p->nSimWords * iVar16;
LAB_0035cf50:
          if ((int)uVar8 < 0) goto LAB_0035d0e0;
        }
        if (p->vSims->nSize <= (int)uVar8) goto LAB_0035d0e0;
        pwVar14 = p->vSims->pArray + uVar8;
        piVar12 = Vec_MemHashLookup(p_00,pwVar14);
        if (*piVar12 < 0) {
          uVar22 = *pwVar14;
          *pwVar14 = ~uVar22;
          piVar12 = Vec_MemHashLookup(p_00,pwVar14);
          iVar16 = *piVar12;
          uVar6 = *pwVar14;
          *pwVar14 = ~uVar6;
          if (uVar22 != ~uVar6) {
            __assert_fail("Temp == *pInfoObj",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                          ,0x1a1,"Vec_Int_t *Sbc_ManDetectMult(Gia_Man_t *, Vec_Int_t *)");
          }
          if (iVar16 < 0) goto LAB_0035cfdd;
          if (lVar20 <= lVar17) goto LAB_0035d17b;
          iVar16 = iVar16 * 2 + 1;
        }
        else {
          if (lVar20 <= lVar17) {
LAB_0035d17b:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          iVar16 = *piVar12 * 2;
        }
        local_860[lVar17] = iVar16;
      }
LAB_0035cfdd:
      lVar17 = lVar17 + 1;
      iVar7 = p->nObjs;
    } while (lVar17 < iVar7);
  }
  lVar20 = (long)p->vCos->nSize;
  if (0 < lVar20) {
    lVar17 = 0;
    do {
      iVar16 = p->vCos->pArray[lVar17];
      if ((iVar16 < 0) || (iVar7 <= iVar16)) {
LAB_0035d0ff:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar16 = iVar16 * p->nSimWords;
      if ((iVar16 < 0) || (p->vSims->nSize <= iVar16)) {
LAB_0035d0e0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      lVar17 = lVar17 + 1;
    } while (lVar20 != lVar17);
  }
  pVVar4 = p_00->vTable;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
    }
    free(pVVar4);
  }
  pVVar4 = p_00->vNexts;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
    }
    free(pVVar4);
  }
  uVar19 = p_00->iPage;
  __ptr = p_00->ppPages;
  if ((int)uVar19 < 0) {
    if (__ptr == (word **)0x0) goto LAB_0035d0c1;
  }
  else {
    lVar20 = 0;
    do {
      if (__ptr[lVar20] != (word *)0x0) {
        free(__ptr[lVar20]);
        __ptr[lVar20] = (word *)0x0;
      }
      lVar20 = lVar20 + 1;
    } while ((ulong)uVar19 + 1 != lVar20);
  }
  free(__ptr);
LAB_0035d0c1:
  free(p_00);
  return pVVar9;
}

Assistant:

Vec_Int_t * Sbc_ManDetectMult( Gia_Man_t * p, Vec_Int_t * vIns )
{
    int nWords = 1;
    Vec_Int_t * vGia2Out = Vec_IntStartFull( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj; int i, Entry, nIns = Vec_IntSize(vIns)/2;
    word A[64], B[64], R[128], * pInfoObj; word Temp;

    // create hash table
    Vec_Mem_t * vTtMem = Vec_MemAlloc( nWords, 10 );
    Vec_MemHashAlloc( vTtMem, 1000 );
    Sbc_SimMult( A, B, R, nIns );
    for ( i = 0; i < 2*nIns; i++ )
    {
        Vec_MemHashInsert( vTtMem, R+i );
        //printf( "Out %2d : ", i );
        //Extra_PrintHex( stdout, (unsigned *)(R+i), 6 ); printf( "\n" );
    }
    assert( Vec_MemEntryNum(vTtMem) == 2*nIns );

    // alloc simulation info
    Vec_WrdFreeP( &p->vSims );
    p->vSims = Vec_WrdStart( Gia_ManObjNum(p) * nWords );
    p->nSimWords = nWords;

    // mark inputs
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrentId( p, 0 );
    Gia_ManForEachCi( p, pObj, i )
    {
        Gia_ObjSetTravIdCurrent( p, pObj );
        //Wlc_ObjSimPi( p, Gia_ObjId(p, pObj) );
    }

    // assign inputs
    assert( Vec_IntSize(vIns) % 2 == 0 );
    Gia_ManForEachObjVec( vIns, p, pObj, i )
    {
        Gia_ObjSetTravIdCurrent( p, pObj );
        pInfoObj = Wlc_ObjSim( p, Gia_ObjId(p, pObj) );
        *pInfoObj = i < nIns ? A[i] : B[i - nIns];
    }

    // perform simulation
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsTravIdCurrent(p, pObj) )
            continue;

        if ( Gia_ObjIsAnd(pObj) )
            Wlc_ObjSimAnd( p, i );
        else if ( Gia_ObjIsCo(pObj) )
            Wlc_ObjSimCo( p, i );
        else assert( 0 );

        // mark direct polarity
        pInfoObj = Wlc_ObjSim( p, i );
        Entry = *Vec_MemHashLookup( vTtMem, pInfoObj );
        if ( Entry >= 0 )
        {
            Vec_IntWriteEntry( vGia2Out, i, Abc_Var2Lit(Entry, 0) );
            continue;
        }

        // mark negated polarity
        Temp = *pInfoObj;
        Abc_TtNot( pInfoObj, nWords );
        Entry = *Vec_MemHashLookup( vTtMem, pInfoObj );
        Abc_TtNot( pInfoObj, nWords );
        assert( Temp == *pInfoObj );
        if ( Entry >= 0 )
        {
            Vec_IntWriteEntry( vGia2Out, i, Abc_Var2Lit(Entry, 1) );
            continue;
        }
    }

    Gia_ManForEachCo( p, pObj, i )
    {
        pInfoObj = Wlc_ObjSim( p, Gia_ObjId(p, pObj) );
        //printf( "Out %2d : Driver = %5d(%d)", i, Gia_ObjFaninId0p(p, pObj), Gia_ObjFaninC0(pObj) );
        //Extra_PrintHex( stdout, (unsigned *)pInfoObj, 6 ); printf( "\n" );
    }

    // cleanup
    Vec_MemHashFree( vTtMem );
    Vec_MemFreeP( &vTtMem );
    //Vec_WrdFreeP( &p->vSims );
    //p->nSimWords = 0;
    return vGia2Out;
}